

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O2

void __thiscall QTeamCityLogger::QTeamCityLogger(QTeamCityLogger *this,char *filename)

{
  QAbstractTestLogger::QAbstractTestLogger(&this->super_QAbstractTestLogger,filename);
  (this->super_QAbstractTestLogger)._vptr_QAbstractTestLogger =
       (_func_int **)&PTR__QTeamCityLogger_0016a488;
  (this->currTestFuncName)._size = 0x200;
  (this->currTestFuncName).buf = (this->currTestFuncName).staticBuf;
  (this->currTestFuncName).staticBuf[0] = '\0';
  (this->pendingMessages)._size = 0x200;
  (this->pendingMessages).buf = (this->pendingMessages).staticBuf;
  (this->pendingMessages).staticBuf[0] = '\0';
  (this->flowID)._size = 0x200;
  (this->flowID).buf = (this->flowID).staticBuf;
  (this->flowID).staticBuf[0] = '\0';
  return;
}

Assistant:

QTeamCityLogger::QTeamCityLogger(const char *filename)
    : QAbstractTestLogger(filename)
{
}